

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O1

void generate_specialized_template<unsigned_short>(unsigned_short denom)

{
  long lVar1;
  ostream *poVar2;
  long *plVar3;
  long *plVar4;
  long *local_a0;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"template<> struct libdivide_constants",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"uint16_t",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"> ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{ ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"static constexpr ",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"libdivide_u16_t",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," libdivide = { ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".magic = ",9);
  const_macro_name<unsigned_short>(&local_40,denom);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_70 = *plVar4;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_80,local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".more = ",8);
  const_macro_name<unsigned_short>(&local_60,denom);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_90 = *plVar4;
    lStack_88 = plVar3[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar4;
    local_a0 = (long *)*plVar3;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_a0,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"};\n",3);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void generate_specialized_template(_IntT denom) {
    std::cout << "template<> struct libdivide_constants"
        << "<" << type_name<_IntT>::get_name() << "," << denom << "> "
        << "{ "
        << "static constexpr " << struct_selector<_IntT>::get_name() << " libdivide = { "
        <<              ".magic = " << const_macro_name(denom)+"_MAGIC, "
        <<              ".more = " <<  const_macro_name(denom)+"_MORE};"
        << "};\n";
}